

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::emitPrototypeInputs(PrintC *this,FuncProto *proto)

{
  EmitXml *pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_79;
  string local_78 [32];
  Atom local_58;
  long local_30;
  Symbol *sym;
  ProtoParameter *param;
  int4 i;
  int4 sz;
  FuncProto *proto_local;
  PrintC *this_local;
  
  _i = proto;
  proto_local = (FuncProto *)this;
  param._4_4_ = FuncProto::numParams(proto);
  if (param._4_4_ == 0) {
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"void",0);
  }
  else {
    for (param._0_4_ = 0; (int)param < param._4_4_; param._0_4_ = (int)param + 1) {
      if ((int)param != 0) {
        pEVar1 = (this->super_PrintLanguage).emit;
        (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,",",8);
      }
      sym = (Symbol *)FuncProto::getParam(_i,(int)param);
      iVar3 = (*sym->_vptr_Symbol[0x11])();
      local_30 = CONCAT44(extraout_var,iVar3);
      if (local_30 == 0) {
        iVar3 = (*sym->_vptr_Symbol[3])();
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])
                  (this,CONCAT44(extraout_var_00,iVar3),1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_78,"",&local_79);
        PrintLanguage::Atom::Atom(&local_58,(string *)local_78,blanktoken,no_color);
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
        iVar3 = (*sym->_vptr_Symbol[3])();
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])
                  (this,CONCAT44(extraout_var_01,iVar3));
        PrintLanguage::recurse(&this->super_PrintLanguage);
      }
      else {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[10])(this,local_30);
      }
    }
  }
  bVar2 = FuncProto::isDotdotdot(_i);
  if (bVar2) {
    if (param._4_4_ != 0) {
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,",",8);
    }
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"...",8);
  }
  return;
}

Assistant:

void PrintC::emitPrototypeInputs(const FuncProto *proto)

{
  int4 sz = proto->numParams();
  
  if (sz == 0)
    emit->print("void",EmitXml::keyword_color);
  else {
    for(int4 i=0;i<sz;++i) {
      if (i!=0)
	emit->print(",");
      ProtoParameter *param = proto->getParam(i);
      Symbol *sym = param->getSymbol();
      if (sym != (Symbol *)0)
	emitVarDecl(sym);
      else {
	// Emit type without name, if there is no backing symbol
	pushTypeStart(param->getType(),true);
	pushAtom(Atom("",blanktoken,EmitXml::no_color));
	pushTypeEnd(param->getType());
	recurse();
      }
    }
  }
  if (proto->isDotdotdot()) {
    if (sz != 0)
      emit->print(",");
    emit->print("...");
  }
}